

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O0

void __thiscall Diligent::ShaderResourceCacheVk::~ShaderResourceCacheVk(ShaderResourceCacheVk *this)

{
  bool bVar1;
  Resource *pRVar2;
  DescriptorSet *this_00;
  uint local_20;
  uint local_1c;
  Uint32 t;
  Uint32 res;
  Resource *pResources;
  ShaderResourceCacheVk *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_pMemory);
  if (bVar1) {
    pRVar2 = GetFirstResourcePtr(this);
    for (local_1c = 0; local_1c < (*(uint *)&this->field_0x1c & 0x7fffffff); local_1c = local_1c + 1
        ) {
      Resource::~Resource(pRVar2 + local_1c);
    }
    for (local_20 = 0; local_20 < this->m_NumSets; local_20 = local_20 + 1) {
      this_00 = GetDescriptorSet(this,local_20);
      DescriptorSet::~DescriptorSet(this_00);
    }
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&this->m_DbgInitializedResources);
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
            (&this->m_pMemory);
  return;
}

Assistant:

ShaderResourceCacheVk::~ShaderResourceCacheVk()
{
    if (m_pMemory)
    {
        Resource* pResources = GetFirstResourcePtr();
        for (Uint32 res = 0; res < m_TotalResources; ++res)
            pResources[res].~Resource();
        for (Uint32 t = 0; t < m_NumSets; ++t)
            GetDescriptorSet(t).~DescriptorSet();
    }
}